

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

void __thiscall
stackjit::ByteCodeParser::parseFunctionBody
          (ByteCodeParser *this,Assembly *assembly,Function *currentFunction)

{
  bool bVar1;
  runtime_error *this_00;
  vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_> *this_01;
  undefined1 local_d0 [64];
  ByteCodeParser local_90;
  undefined1 local_60 [64];
  Function *local_20;
  Function *currentFunction_local;
  Assembly *assembly_local;
  ByteCodeParser *this_local;
  
  local_20 = currentFunction;
  currentFunction_local = (Function *)assembly;
  assembly_local = (Assembly *)this;
  nextToken_abi_cxx11_((ByteCodeParser *)(local_60 + 0x20));
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  currentToken_abi_cxx11_((ByteCodeParser *)local_60);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"{");
  std::__cxx11::string::~string((string *)local_60);
  if (!bVar1) {
    nextToken_abi_cxx11_(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    this->mLocalsSet = false;
    while( true ) {
      currentToken_abi_cxx11_((ByteCodeParser *)(local_d0 + 0x20));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_d0 + 0x20),"}");
      std::__cxx11::string::~string((string *)(local_d0 + 0x20));
      if (bVar1) break;
      parseInstruction(this,local_20);
      nextToken_abi_cxx11_((ByteCodeParser *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
    }
    this_01 = Loader::Assembly::functions((Assembly *)currentFunction_local);
    std::vector<stackjit::Loader::Function,_std::allocator<stackjit::Loader::Function>_>::push_back
              (this_01,local_20);
    nextTokenAtEnd(this);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Expected \'{\' after function definition.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ByteCodeParser::parseFunctionBody(Loader::Assembly& assembly, Loader::Function& currentFunction) {
		nextToken();
		if (currentToken() != "{") {
			throw std::runtime_error("Expected '{' after function definition.");
		}
		nextToken();

		mLocalsSet = false;
		while (true) {
			if (currentToken() == "}") {
				assembly.functions().push_back(currentFunction);
				nextTokenAtEnd();
				break;
			} else {
				parseInstruction(currentFunction);
			}

			nextToken();
		}
	}